

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O1

float crnlib::quadratic_approx_filter(float t)

{
  float fVar1;
  float fVar2;
  
  fVar2 = -t;
  if (-t <= t) {
    fVar2 = t;
  }
  fVar1 = 0.0;
  if (fVar2 < 1.5) {
    if (fVar2 <= 0.5) {
      return 0.75 - fVar2 * fVar2;
    }
    fVar1 = fVar2 * -1.5 + fVar2 * fVar2 * 0.5 + 1.125;
  }
  return fVar1;
}

Assistant:

static float quadratic_approx_filter(float t) {
  return quadratic(t, .5f);
}